

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void __thiscall duckdb::ZSTDCompressionState::FlushSegment(ZSTDCompressionState *this)

{
  page_offset_t pVar1;
  ColumnCheckpointState *pCVar2;
  idx_t iVar3;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_50;
  BufferHandle local_48;
  
  pCVar2 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
  if ((this->current_buffer).ptr == &this->segment_handle) {
    pVar1 = GetCurrentOffset(this);
    iVar3 = (idx_t)pVar1;
  }
  else {
    iVar3 = CompressionInfo::GetBlockSize(&(this->super_CompressionState).info);
  }
  local_50._M_head_impl =
       (this->segment).
       super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
       super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
       super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl;
  (this->segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&local_48,&this->segment_handle);
  (*pCVar2->_vptr_ColumnCheckpointState[4])(pCVar2,&local_50,&local_48,iVar3);
  BufferHandle::~BufferHandle(&local_48);
  ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &local_50);
  this->segment_count = this->segment_count + 1;
  this->vector_in_segment_count = 0;
  return;
}

Assistant:

void FlushSegment() {
		auto &state = checkpoint_data.GetCheckpointState();
		idx_t segment_block_size;

		if (current_buffer.get() == &segment_handle) {
			segment_block_size = GetCurrentOffset();
		} else {
			// Block is fully used
			segment_block_size = info.GetBlockSize();
		}

		state.FlushSegment(std::move(segment), std::move(segment_handle), segment_block_size);
		segment_count++;
		vector_in_segment_count = 0;
	}